

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderIntegerFunctionTests.cpp
# Opt level: O2

void __thiscall
vkt::shaderexecutor::BitfieldInsertCaseInstance::~BitfieldInsertCaseInstance
          (BitfieldInsertCaseInstance *this)

{
  IntegerFunctionTestInstance::~IntegerFunctionTestInstance
            (&this->super_IntegerFunctionTestInstance);
  operator_delete(this,0x220);
  return;
}

Assistant:

BitfieldInsertCaseInstance (Context& context, glu::ShaderType shaderType, const ShaderSpec& spec, int numValues, const char* name)
		: IntegerFunctionTestInstance	(context, shaderType, spec, numValues, name)
	{
	}